

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

void ggml_set_f32_1d(ggml_tensor *tensor,int i,float value)

{
  undefined1 in_register_00001204 [12];
  undefined1 auVar1 [16];
  
  auVar1._4_12_ = in_register_00001204;
  auVar1._0_4_ = value;
  switch(tensor->type) {
  case GGML_TYPE_Q4_0:
    goto switchD_00124805_caseD_0;
  case GGML_TYPE_Q4_1:
switchD_00124805_caseD_1:
    ggml_set_f32_1d_cold_7();
  case GGML_TYPE_COUNT:
    ggml_set_f32_1d_cold_1();
  case GGML_TYPE_I8:
    if (tensor->nb[0] == 1) {
      *(char *)((long)tensor->data + (long)i) = (char)(int)value;
      return;
    }
    break;
  case GGML_TYPE_I16:
    if (tensor->nb[0] == 2) {
      *(short *)((long)tensor->data + (long)i * 2) = (short)(int)value;
      return;
    }
    ggml_set_f32_1d_cold_5();
    break;
  case GGML_TYPE_I32:
    if (tensor->nb[0] == 4) {
      *(int *)((long)tensor->data + (long)i * 4) = (int)value;
      return;
    }
    goto LAB_001248a1;
  case GGML_TYPE_F16:
    if (tensor->nb[0] == 2) {
      auVar1 = vcvtps2ph_f16c(auVar1,0);
      vpextrw_avx(auVar1,0);
      return;
    }
    goto LAB_001248a6;
  case GGML_TYPE_F32:
    if (tensor->nb[0] == 4) {
      *(float *)((long)tensor->data + (long)i * 4) = value;
      return;
    }
    goto LAB_0012489c;
  default:
    return;
  }
  ggml_set_f32_1d_cold_6();
LAB_0012489c:
  ggml_set_f32_1d_cold_2();
LAB_001248a1:
  ggml_set_f32_1d_cold_4();
LAB_001248a6:
  ggml_set_f32_1d_cold_3();
switchD_00124805_caseD_0:
  ggml_set_f32_1d_cold_8();
  goto switchD_00124805_caseD_1;
}

Assistant:

void ggml_set_f32_1d(const struct ggml_tensor * tensor, int i, float value) {
    switch (tensor->type) {
        case GGML_TYPE_Q4_0:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_Q4_1:
            {
                GGML_ASSERT(false);
            } break;
        case GGML_TYPE_I8:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int8_t));
                ((int8_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int16_t));
                ((int16_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_I32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(int32_t));
                ((int32_t *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_F16:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(ggml_fp16_t));
                ((ggml_fp16_t *)(tensor->data))[i] = GGML_FP32_TO_FP16(value);
            } break;
        case GGML_TYPE_F32:
            {
                GGML_ASSERT(tensor->nb[0] == sizeof(float));
                ((float *)(tensor->data))[i] = value;
            } break;
        case GGML_TYPE_COUNT:
            {
                GGML_ASSERT(false);
            } break;
    }
}